

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmanager.cpp
# Opt level: O2

string * __thiscall
ICM::ObjectPtr::to_string_abi_cxx11_(string *__return_storage_ptr__,ObjectPtr *this)

{
  allocator local_9;
  
  if (this->data == (Object *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Null",&local_9);
  }
  else {
    Object::to_string_abi_cxx11_(__return_storage_ptr__,this->data);
  }
  return __return_storage_ptr__;
}

Assistant:

string ObjectPtr::to_string() const {
		if (this->get() == nullptr)
			return "Null";
		return this->get()->to_string();
	}